

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.h
# Opt level: O2

void __thiscall
duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::resize
          (SparseArray<duckdb_re2::NFA::Thread_*> *this,int new_max_size)

{
  int old_max_size;
  _Head_base<1UL,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter,_false>
  min;
  PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue> b;
  PODArray<int> a;
  __uniq_ptr_impl<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
  local_50;
  __uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter> local_40;
  
  min._M_head_impl.len_ = (Deleter)0;
  if ((this->dense_).ptr_._M_t.
      super___uniq_ptr_impl<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
      .
      super__Head_base<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_false>
      ._M_head_impl != (IndexValue *)0x0) {
    min._M_head_impl.len_ =
         (this->dense_).ptr_._M_t.
         super___uniq_ptr_impl<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
         .
         super__Tuple_impl<1UL,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
         .
         super__Head_base<1UL,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter,_false>
         ._M_head_impl;
  }
  if ((int)min._M_head_impl.len_ < new_max_size) {
    PODArray<int>::PODArray((PODArray<int> *)&local_40,new_max_size);
    PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::PODArray
              ((PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue> *)&local_50
               ,new_max_size);
    if (0 < (int)min._M_head_impl.len_) {
      memmove(local_40._M_t.super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
              super__Head_base<0UL,_int_*,_false>._M_head_impl,
              (this->sparse_).ptr_._M_t.
              super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
              super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
              super__Head_base<0UL,_int_*,_false>._M_head_impl,
              (ulong)(uint)min._M_head_impl.len_ * 4);
      memmove(local_50._M_t.
              super__Tuple_impl<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
              .
              super__Head_base<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_false>
              ._M_head_impl,
              (this->dense_).ptr_._M_t.
              super___uniq_ptr_impl<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
              .
              super__Head_base<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_false>
              ._M_head_impl,(ulong)(uint)min._M_head_impl.len_ << 4);
    }
    std::__uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>::operator=
              ((__uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter> *)&this->sparse_,&local_40)
    ;
    std::
    __uniq_ptr_impl<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
    ::operator=((__uniq_ptr_impl<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
                 *)&this->dense_,&local_50);
    MaybeInitializeMemory(this,(int)min._M_head_impl.len_,new_max_size);
    std::
    unique_ptr<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue[],_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
    ::~unique_ptr((unique_ptr<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue[],_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
                   *)&local_50);
    std::unique_ptr<int[],_duckdb_re2::PODArray<int>::Deleter>::~unique_ptr
              ((unique_ptr<int[],_duckdb_re2::PODArray<int>::Deleter> *)&local_40);
  }
  if (new_max_size < this->size_) {
    this->size_ = new_max_size;
  }
  return;
}

Assistant:

void SparseArray<Value>::resize(int new_max_size) {
  DebugCheckInvariants();
  if (new_max_size > max_size()) {
    const int old_max_size = max_size();

    // Construct these first for exception safety.
    PODArray<int> a(new_max_size);
    PODArray<IndexValue> b(new_max_size);

    std::copy_n(sparse_.data(), old_max_size, a.data());
    std::copy_n(dense_.data(), old_max_size, b.data());

    sparse_ = std::move(a);
    dense_ = std::move(b);

    MaybeInitializeMemory(old_max_size, new_max_size);
  }
  if (size_ > new_max_size)
    size_ = new_max_size;
  DebugCheckInvariants();
}